

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::LiteTest_AllLite35_Test<absl::lts_20250127::Cord>::
~LiteTest_AllLite35_Test(LiteTest_AllLite35_Test<absl::lts_20250127::Cord> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST(LiteTest, AllLite35) {
  std::string data;

  {
    // DuplicatedKeyWireFormat
    proto2_unittest::TestMapLite message;

    // Two key fields in wire format
    std::string data = "\x0A\x06\x08\x01\x08\x02\x10\x01";

    EXPECT_TRUE(message.ParseFromString(data));
    ASSERT_EQ(1, message.map_int32_int32().size());
    EXPECT_EQ(1, message.map_int32_int32().at(2));
  }
}